

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O0

RCOError __thiscall RCO::loadElement(RCO *this,RCOElement *el,uint32_t offset)

{
  undefined8 uVar1;
  RCOError RVar2;
  undefined1 local_138 [8];
  RCOElement next_sibling;
  undefined1 local_b8 [8];
  RCOElement first_child;
  uint32_t root_attr_offset;
  rco_tree_table_element element;
  RCOError err;
  uint32_t offset_local;
  RCOElement *el_local;
  RCO *this_local;
  
  unique0x00012000 = *(undefined8 *)(this->mBuffer + offset);
  uVar1 = *(undefined8 *)(this->mBuffer + (ulong)offset + 0x10);
  first_child._104_4_ = offset + 0x1c;
  RVar2 = getStringTableString(this,&el->name,first_child.originalSize);
  if (RVar2 == NO_ERROR) {
    element.first_child = loadAttributes(this,el,first_child._104_4_,root_attr_offset);
    RVar2 = element.first_child;
    if (element.first_child == NO_ERROR) {
      element.previous_sibling = (uint32_t)((ulong)uVar1 >> 0x20);
      if (element.previous_sibling != 0xffffffff) {
        RCOElement::RCOElement((RCOElement *)local_b8);
        element.first_child =
             loadElement(this,(RCOElement *)local_b8,
                         (this->mHeader).tree_start_off + element.previous_sibling);
        RVar2 = element.first_child;
        if (element.first_child == NO_ERROR) {
          std::vector<RCOElement,_std::allocator<RCOElement>_>::push_back
                    (&el->children,(value_type *)local_b8);
          RVar2 = this_local._4_4_;
        }
        this_local._4_4_ = RVar2;
        next_sibling._105_3_ = 0;
        next_sibling.isCompressed = element.first_child != NO_ERROR;
        RCOElement::~RCOElement((RCOElement *)local_b8);
        if (next_sibling._104_4_ != 0) {
          return this_local._4_4_;
        }
      }
      element.parent = (uint32_t)uVar1;
      if (element.parent != 0xffffffff) {
        RCOElement::RCOElement((RCOElement *)local_138);
        element.first_child =
             loadElement(this,(RCOElement *)local_138,
                         (this->mHeader).tree_start_off + element.parent);
        RVar2 = element.first_child;
        if (element.first_child == NO_ERROR) {
          std::vector<RCOElement,_std::allocator<RCOElement>_>::push_back
                    (&el->siblings,(value_type *)local_138);
          RVar2 = this_local._4_4_;
        }
        this_local._4_4_ = RVar2;
        next_sibling._105_3_ = 0;
        next_sibling.isCompressed = element.first_child != NO_ERROR;
        RCOElement::~RCOElement((RCOElement *)local_138);
        if (next_sibling._104_4_ != 0) {
          return this_local._4_4_;
        }
      }
      this_local._4_4_ = element.first_child;
      RVar2 = this_local._4_4_;
    }
  }
  this_local._4_4_ = RVar2;
  return this_local._4_4_;
}

Assistant:

RCOError RCO::loadElement(RCOElement &el, uint32_t offset)
{
	RCOError err;

	rco_tree_table_element element;

	memcpy(&element, mBuffer + offset, sizeof(rco_tree_table_element));

	uint32_t root_attr_offset = offset + sizeof(rco_tree_table_element);

	err = getStringTableString(el.name, element.element_offset);

	if (err != NO_ERROR)
		return err;

	err = loadAttributes(el, root_attr_offset, element.attr_ct);

	if (err != NO_ERROR)
		return err;

	if (element.first_child != 0xFFFFFFFF)
	{
		RCOElement first_child;
		err = loadElement(first_child, mHeader.tree_start_off + element.first_child);
		if (err != NO_ERROR)
			return err;
		el.children.push_back(first_child);
	}

	if (element.next_sibling != 0xFFFFFFFF)
	{
		RCOElement next_sibling;
		err = loadElement(next_sibling, mHeader.tree_start_off + element.next_sibling);
		if (err != NO_ERROR)
			return err;
		el.siblings.push_back(next_sibling);
	}

	return err;
}